

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

void read_palette_mode_info(AV1_COMMON *cm,MACROBLOCKD *xd,aom_reader *r)

{
  MB_MODE_INFO *pMVar1;
  int iVar2;
  int iVar3;
  MACROBLOCKD *in_RSI;
  AV1_COMMON *in_RDI;
  int modev_1;
  int palette_uv_mode_ctx;
  int modev;
  int palette_mode_ctx;
  int bsize_ctx;
  PALETTE_MODE_INFO *pmi;
  undefined4 in_stack_00000028;
  int in_stack_0000002c;
  BLOCK_SIZE bsize;
  MB_MODE_INFO *mbmi;
  int num_planes;
  aom_cdf_prob *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  iVar2 = av1_num_planes(in_RDI);
  pMVar1 = *in_RSI->mi;
  av1_get_palette_bsize_ctx(pMVar1->bsize);
  if (pMVar1->mode == '\0') {
    av1_get_palette_mode_ctx(in_RSI);
    iVar3 = aom_read_symbol_((aom_reader *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             in_stack_ffffffffffffffa8,0);
    if (iVar3 != 0) {
      iVar3 = aom_read_symbol_((aom_reader *)
                               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                               in_stack_ffffffffffffffa8,0);
      (pMVar1->palette_mode_info).palette_size[0] = (char)iVar3 + '\x02';
      read_palette_colors_y((MACROBLOCKD *)mbmi,in_stack_0000002c,pmi,_palette_mode_ctx);
    }
  }
  if ((((1 < iVar2) && (pMVar1->uv_mode == '\0')) && ((in_RSI->is_chroma_ref & 1U) != 0)) &&
     (iVar2 = aom_read_symbol_((aom_reader *)
                               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                               in_stack_ffffffffffffffa8,0), iVar2 != 0)) {
    iVar2 = aom_read_symbol_((aom_reader *)CONCAT44(iVar2,in_stack_ffffffffffffffb0),
                             in_stack_ffffffffffffffa8,0);
    (pMVar1->palette_mode_info).palette_size[1] = (char)iVar2 + '\x02';
    read_palette_colors_uv
              ((MACROBLOCKD *)r,num_planes,(PALETTE_MODE_INFO *)mbmi,
               (aom_reader *)CONCAT44(in_stack_0000002c,in_stack_00000028));
  }
  return;
}

Assistant:

static void read_palette_mode_info(AV1_COMMON *const cm, MACROBLOCKD *const xd,
                                   aom_reader *r) {
  const int num_planes = av1_num_planes(cm);
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const BLOCK_SIZE bsize = mbmi->bsize;
  assert(av1_allow_palette(cm->features.allow_screen_content_tools, bsize));
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  const int bsize_ctx = av1_get_palette_bsize_ctx(bsize);

  if (mbmi->mode == DC_PRED) {
    const int palette_mode_ctx = av1_get_palette_mode_ctx(xd);
    const int modev = aom_read_symbol(
        r, xd->tile_ctx->palette_y_mode_cdf[bsize_ctx][palette_mode_ctx], 2,
        ACCT_STR);
    if (modev) {
      pmi->palette_size[0] =
          aom_read_symbol(r, xd->tile_ctx->palette_y_size_cdf[bsize_ctx],
                          PALETTE_SIZES, ACCT_STR) +
          2;
      read_palette_colors_y(xd, cm->seq_params->bit_depth, pmi, r);
    }
  }
  if (num_planes > 1 && mbmi->uv_mode == UV_DC_PRED && xd->is_chroma_ref) {
    const int palette_uv_mode_ctx = (pmi->palette_size[0] > 0);
    const int modev = aom_read_symbol(
        r, xd->tile_ctx->palette_uv_mode_cdf[palette_uv_mode_ctx], 2, ACCT_STR);
    if (modev) {
      pmi->palette_size[1] =
          aom_read_symbol(r, xd->tile_ctx->palette_uv_size_cdf[bsize_ctx],
                          PALETTE_SIZES, ACCT_STR) +
          2;
      read_palette_colors_uv(xd, cm->seq_params->bit_depth, pmi, r);
    }
  }
}